

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int xmlHashUpdateEntry3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                       void *userdata,xmlHashDeallocator f)

{
  int iVar1;
  unsigned_long uVar2;
  _xmlHashEntry *p_Var3;
  _xmlHashEntry *p_Var4;
  xmlChar *pxVar5;
  _xmlHashEntry *p_Var6;
  xmlChar *local_48;
  
  if (name == (xmlChar *)0x0 || table == (xmlHashTablePtr)0x0) {
    return -1;
  }
  local_48 = name3;
  if (table->dict != (xmlDictPtr)0x0) {
    iVar1 = xmlDictOwns(table->dict,name);
    if ((iVar1 == 0) && (name = xmlDictLookup(table->dict,name,-1), name == (xmlChar *)0x0)) {
      return -1;
    }
    if (name2 == (xmlChar *)0x0) {
      name2 = (xmlChar *)0x0;
    }
    else {
      iVar1 = xmlDictOwns(table->dict,name2);
      if ((iVar1 == 0) && (name2 = xmlDictLookup(table->dict,name2,-1), name2 == (xmlChar *)0x0)) {
        return -1;
      }
    }
    if (name3 == (xmlChar *)0x0) {
      local_48 = (xmlChar *)0x0;
    }
    else {
      iVar1 = xmlDictOwns(table->dict,name3);
      if ((iVar1 == 0) &&
         (local_48 = xmlDictLookup(table->dict,name3,-1), local_48 == (xmlChar *)0x0)) {
        return -1;
      }
    }
  }
  uVar2 = xmlHashComputeKey(table,name,name2,local_48);
  if (table->table[uVar2].valid == 0) {
    p_Var6 = (_xmlHashEntry *)0x0;
LAB_001499bf:
    if (p_Var6 == (_xmlHashEntry *)0x0) {
      p_Var4 = table->table + uVar2;
    }
    else {
      p_Var4 = (_xmlHashEntry *)(*xmlMalloc)(0x30);
      if (p_Var4 == (_xmlHashEntry *)0x0) {
        return -1;
      }
    }
    if (table->dict == (xmlDictPtr)0x0) {
      pxVar5 = xmlStrdup(name);
      p_Var4->name = pxVar5;
      pxVar5 = xmlStrdup(name2);
      p_Var4->name2 = pxVar5;
      local_48 = xmlStrdup(local_48);
    }
    else {
      p_Var4->name = name;
      p_Var4->name2 = name2;
    }
    p_Var4->name3 = local_48;
    p_Var4->payload = userdata;
    p_Var4->next = (_xmlHashEntry *)0x0;
    p_Var4->valid = 1;
    table->nbElems = table->nbElems + 1;
    if (p_Var6 != (_xmlHashEntry *)0x0) {
      p_Var6->next = p_Var4;
    }
    return 0;
  }
  p_Var6 = table->table + uVar2;
  p_Var4 = p_Var6->next;
  if (table->dict == (xmlDictPtr)0x0) {
    while (p_Var4 != (_xmlHashEntry *)0x0) {
      iVar1 = xmlStrEqual(p_Var6->name,name);
      if (((iVar1 != 0) && (iVar1 = xmlStrEqual(p_Var6->name2,name2), iVar1 != 0)) &&
         (iVar1 = xmlStrEqual(p_Var6->name3,local_48), iVar1 != 0)) goto LAB_0014999d;
      p_Var6 = p_Var6->next;
      p_Var4 = p_Var6->next;
    }
    iVar1 = xmlStrEqual(p_Var6->name,name);
    if (((iVar1 == 0) || (iVar1 = xmlStrEqual(p_Var6->name2,name2), iVar1 == 0)) ||
       (iVar1 = xmlStrEqual(p_Var6->name3,local_48), iVar1 == 0)) goto LAB_001499bf;
LAB_0014999d:
    if (f == (xmlHashDeallocator)0x0) goto LAB_001499b1;
    pxVar5 = p_Var6->name;
  }
  else {
    while (p_Var3 = p_Var4, p_Var3 != (_xmlHashEntry *)0x0) {
      if (((p_Var6->name == name) && (p_Var6->name2 == name2)) && (p_Var6->name3 == local_48)) {
        if (f != (xmlHashDeallocator)0x0) {
          (*f)(p_Var6->payload,p_Var6->name);
        }
        p_Var6->payload = userdata;
        return 0;
      }
      p_Var6 = p_Var3;
      p_Var4 = p_Var3->next;
    }
    pxVar5 = p_Var6->name;
    if (((pxVar5 != name) || (p_Var6->name2 != name2)) || (p_Var6->name3 != local_48))
    goto LAB_001499bf;
    if (f == (xmlHashDeallocator)0x0) goto LAB_001499b1;
  }
  (*f)(p_Var6->payload,pxVar5);
LAB_001499b1:
  p_Var6->payload = userdata;
  return 0;
}

Assistant:

int
xmlHashUpdateEntry3(xmlHashTablePtr table, const xmlChar *name,
	           const xmlChar *name2, const xmlChar *name3,
		   void *userdata, xmlHashDeallocator f) {
    unsigned long key;
    xmlHashEntryPtr entry;
    xmlHashEntryPtr insert;

    if ((table == NULL) || name == NULL)
	return(-1);

    /*
     * If using a dict internalize if needed
     */
    if (table->dict) {
        if (!xmlDictOwns(table->dict, name)) {
	    name = xmlDictLookup(table->dict, name, -1);
	    if (name == NULL)
	        return(-1);
	}
        if ((name2 != NULL) && (!xmlDictOwns(table->dict, name2))) {
	    name2 = xmlDictLookup(table->dict, name2, -1);
	    if (name2 == NULL)
	        return(-1);
	}
        if ((name3 != NULL) && (!xmlDictOwns(table->dict, name3))) {
	    name3 = xmlDictLookup(table->dict, name3, -1);
	    if (name3 == NULL)
	        return(-1);
	}
    }

    /*
     * Check for duplicate and insertion location.
     */
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0) {
	insert = NULL;
    } else {
        if (table ->dict) {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((insert->name == name) &&
		    (insert->name2 == name2) &&
		    (insert->name3 == name3)) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((insert->name == name) &&
		(insert->name2 == name2) &&
		(insert->name3 == name3)) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	} else {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((xmlStrEqual(insert->name, name)) &&
		    (xmlStrEqual(insert->name2, name2)) &&
		    (xmlStrEqual(insert->name3, name3))) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((xmlStrEqual(insert->name, name)) &&
		(xmlStrEqual(insert->name2, name2)) &&
		(xmlStrEqual(insert->name3, name3))) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	}
    }

    if (insert == NULL) {
	entry =  &(table->table[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlHashEntry));
	if (entry == NULL)
	     return(-1);
    }

    if (table->dict != NULL) {
        entry->name = (xmlChar *) name;
        entry->name2 = (xmlChar *) name2;
        entry->name3 = (xmlChar *) name3;
    } else {
	entry->name = xmlStrdup(name);
	entry->name2 = xmlStrdup(name2);
	entry->name3 = xmlStrdup(name3);
    }
    entry->payload = userdata;
    entry->next = NULL;
    entry->valid = 1;
    table->nbElems++;


    if (insert != NULL) {
	insert->next = entry;
    }
    return(0);
}